

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

string * __thiscall
pfederc::ModExpr::toString_abi_cxx11_(string *__return_storage_ptr__,ModExpr *this)

{
  bool bVar1;
  Token *pTVar2;
  Lexer *pLVar3;
  pointer pEVar4;
  string local_a0 [32];
  reference local_80;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr;
  const_iterator __end1;
  const_iterator __begin1;
  Exprs *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  ModExpr *local_18;
  ModExpr *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (ModExpr *)__return_storage_ptr__;
  pTVar2 = getIdentifier(this);
  pLVar3 = Expr::getLexer(&this->super_Expr);
  (*pTVar2->_vptr_Token[2])
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,pTVar2,
             pLVar3);
  std::operator+(&local_40,"module ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1);
  std::operator+(__return_storage_ptr__,&local_40,'\n');
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&__range1);
  __end1 = std::
           vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ::begin(&this->exprs);
  expr = (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
         std::
         vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
         ::end(&this->exprs);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                                     *)&expr), bVar1) {
    local_80 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
               ::operator*(&__end1);
    pEVar4 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                       (local_80);
    (*pEVar4->_vptr_Expr[2])();
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_a0);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,';');
  return __return_storage_ptr__;
}

Assistant:

std::string ModExpr::toString() const noexcept {
  std::string result = "module " + getIdentifier().toString(getLexer()) + '\n';
  for (const auto &expr : exprs) {
    result += expr->toString();
    result += '\n';
  }
  result += ';';
  return result;
}